

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void parse_example_tweaks(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  bool *pbVar3;
  size_t *psVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  option_group_definition *poVar8;
  typed_option<unsigned_int> *ptVar9;
  typed_option<unsigned_long> *ptVar10;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar11;
  typed_option<float> *ptVar12;
  namedlabels *pnVar13;
  ostream *poVar14;
  loss_function *plVar15;
  options_i *poVar16;
  byte bVar17;
  float fVar18;
  float fVar19;
  bool test_only;
  float loss_parameter;
  string loss_function;
  string named_labels;
  option_group_definition example_options;
  size_t early_terminate_passes;
  bool local_1b09;
  float *local_1b08;
  float local_1afc;
  float *local_1af8;
  options_i *local_1af0;
  uint32_t *local_1ae8;
  bool *local_1ae0;
  size_t *local_1ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab0;
  undefined1 *local_1a90 [2];
  undefined1 local_1a80 [16];
  string local_1a70;
  undefined1 *local_1a50 [2];
  undefined1 local_1a40 [16];
  undefined1 *local_1a30 [2];
  undefined1 local_1a20 [16];
  string local_1a10;
  undefined1 *local_19f0 [2];
  undefined1 local_19e0 [16];
  string local_19d0;
  undefined1 *local_19b0 [2];
  undefined1 local_19a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1990;
  string local_1970;
  undefined1 *local_1950 [2];
  undefined1 local_1940 [16];
  string local_1930;
  undefined1 *local_1910 [2];
  undefined1 local_1900 [16];
  string local_18f0;
  undefined1 *local_18d0 [2];
  undefined1 local_18c0 [16];
  string local_18b0;
  undefined1 *local_1890 [2];
  undefined1 local_1880 [16];
  string local_1870;
  undefined1 *local_1850 [2];
  undefined1 local_1840 [16];
  string local_1830;
  undefined1 *local_1810 [2];
  undefined1 local_1800 [16];
  string local_17f0;
  undefined1 *local_17d0 [2];
  undefined1 local_17c0 [16];
  string local_17b0;
  undefined1 *local_1790 [2];
  undefined1 local_1780 [16];
  string local_1770;
  undefined1 *local_1750 [2];
  undefined1 local_1740 [16];
  string local_1730;
  undefined1 *local_1710 [2];
  undefined1 local_1700 [16];
  string local_16f0;
  undefined1 *local_16d0 [2];
  undefined1 local_16c0 [16];
  undefined1 *local_16b0 [2];
  undefined1 local_16a0 [16];
  string local_1690;
  undefined1 *local_1670;
  long local_1668;
  undefined1 local_1660 [16];
  option_group_definition local_1650;
  string local_1618;
  string local_15f8;
  undefined1 *local_15d8 [2];
  undefined1 local_15c8 [16];
  string local_15b8;
  string local_1598;
  undefined1 local_1578 [80];
  string local_1528 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_14f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_14e0;
  unsigned_long local_14d8;
  undefined1 local_14d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1438;
  undefined1 local_1430 [112];
  bool local_13c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_13a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1398;
  undefined1 local_1390 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_12f8;
  undefined1 local_12f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1258;
  undefined1 local_1250 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11b8;
  undefined1 local_11b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1118;
  undefined1 local_1110 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1088;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1078;
  undefined1 local_1070 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fe8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fd8;
  undefined1 local_fd0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f38;
  undefined1 local_f30 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e98;
  undefined1 local_e90 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_df8;
  undefined1 local_df0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d58;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d50;
  typed_option<bool> local_cb0;
  typed_option<float> local_c10;
  typed_option<float> local_b70;
  typed_option<float> local_ad0;
  typed_option<float> local_a30;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<bool> local_850;
  typed_option<float> local_7b0;
  typed_option<float> local_710;
  typed_option<unsigned_long> local_670;
  typed_option<unsigned_long> local_5d0;
  typed_option<unsigned_long> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<unsigned_long> local_3f0;
  typed_option<unsigned_int> local_350;
  typed_option<unsigned_int> local_2b0;
  typed_option<unsigned_int> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  local_1ab0._M_dataplus._M_p = (pointer)&local_1ab0.field_2;
  local_1ab0._M_string_length = 0;
  local_1ab0.field_2._M_local_buf[0] = '\0';
  local_1ad0._M_dataplus._M_p = (pointer)&local_1ad0.field_2;
  local_1ad0._M_string_length = 0;
  local_1ad0.field_2._M_local_buf[0] = '\0';
  local_1afc = 0.0;
  local_1b09 = false;
  local_1670 = local_1660;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1670,"Example options","");
  local_1650.m_name._M_dataplus._M_p = (pointer)&local_1650.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1650,local_1670,local_1670 + local_1668);
  local_1650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1670 != local_1660) {
    operator_delete(local_1670);
  }
  local_1690._M_dataplus._M_p = (pointer)&local_1690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1690,"testonly","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1578,&local_1690,&local_1b09);
  local_16b0[0] = local_16a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16b0,"t","");
  std::__cxx11::string::_M_assign(local_1528);
  local_16d0[0] = local_16c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16d0,"Ignore label information and just test","");
  std::__cxx11::string::_M_assign((string *)(local_1578 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_1578);
  poVar8 = VW::config::option_group_definition::add<bool>(&local_1650,&local_d0);
  local_16f0._M_dataplus._M_p = (pointer)&local_16f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16f0,"holdout_off","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_14d0,&local_16f0,&all->holdout_set_off);
  local_1710[0] = local_1700;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1710,"no holdout data in multiple passes","");
  std::__cxx11::string::_M_assign((string *)(local_14d0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_14d0);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_170);
  local_1730._M_dataplus._M_p = (pointer)&local_1730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1730,"holdout_period","");
  VW::config::typed_option<unsigned_int>::typed_option(&local_2b0,&local_1730,&all->holdout_period);
  ptVar9 = VW::config::typed_option<unsigned_int>::default_value(&local_2b0,10);
  local_1750[0] = local_1740;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1750,"holdout period for test only","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_210,ptVar9);
  poVar8 = VW::config::option_group_definition::add<unsigned_int>(poVar8,&local_210);
  local_1770._M_dataplus._M_p = (pointer)&local_1770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1770,"holdout_after","");
  local_1ae8 = &all->holdout_after;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_df0,&local_1770,local_1ae8);
  local_1790[0] = local_1780;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1790,
             "holdout after n training examples, default off (disables holdout_period)","");
  std::__cxx11::string::_M_assign((string *)(local_df0 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_350,(typed_option<unsigned_int> *)local_df0);
  poVar8 = VW::config::option_group_definition::add<unsigned_int>(poVar8,&local_350);
  local_17b0._M_dataplus._M_p = (pointer)&local_17b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17b0,"early_terminate","");
  VW::config::typed_option<unsigned_long>::typed_option(&local_490,&local_17b0,&local_14d8);
  ptVar10 = VW::config::typed_option<unsigned_long>::default_value(&local_490,3);
  local_17d0[0] = local_17c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17d0,
             "Specify the number of passes tolerated when holdout loss doesn\'t decrease before early termination"
             ,"");
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_3f0,ptVar10);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_3f0);
  local_17f0._M_dataplus._M_p = (pointer)&local_17f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17f0,"passes","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_e90,&local_17f0,&all->numpasses);
  local_1810[0] = local_1800;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1810,"Number of Training Passes","");
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_530,(typed_option<unsigned_long> *)local_e90);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_530);
  local_1830._M_dataplus._M_p = (pointer)&local_1830.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1830,"initial_pass_length","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_f30,&local_1830,&all->pass_length);
  local_1850[0] = local_1840;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1850,"initial number of examples per pass","");
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_5d0,(typed_option<unsigned_long> *)local_f30);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_5d0);
  local_1870._M_dataplus._M_p = (pointer)&local_1870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1870,"examples","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_fd0,&local_1870,&all->max_examples);
  local_1890[0] = local_1880;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1890,"number of examples to parse","");
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_670,(typed_option<unsigned_long> *)local_fd0);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_670);
  local_18b0._M_dataplus._M_p = (pointer)&local_18b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18b0,"min_prediction","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1070,&local_18b0,&all->sd->min_label);
  local_18d0[0] = local_18c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18d0,"Smallest prediction to output","");
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_710,(typed_option<float> *)local_1070);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_710);
  local_18f0._M_dataplus._M_p = (pointer)&local_18f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18f0,"max_prediction","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1110,&local_18f0,&all->sd->max_label);
  local_1910[0] = local_1900;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1910,"Largest prediction to output","");
  std::__cxx11::string::_M_assign((string *)(local_1110 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_7b0,(typed_option<float> *)local_1110);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_7b0);
  local_1930._M_dataplus._M_p = (pointer)&local_1930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1930,"sort_features","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_11b0,&local_1930,&all->p->sort_features);
  local_1950[0] = local_1940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1950,
             "turn this on to disregard order in which features have been defined. This will lead to smaller cache sizes"
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_11b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_850,(typed_option<bool> *)local_11b0);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_850);
  local_1970._M_dataplus._M_p = (pointer)&local_1970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1970,"loss_function","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_990,&local_1970,&local_1ad0);
  local_1990._M_dataplus._M_p = (pointer)&local_1990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1990,"squared","");
  ptVar11 = VW::config::
            typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::default_value(&local_990,&local_1990);
  local_19b0[0] = local_19a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19b0,
             "Specify the loss function to be used, uses squared by default. Currently available ones are squared, classic, hinge, logistic, quantile and poisson."
             ,"");
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,ptVar11);
  poVar8 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar8,&local_8f0);
  local_19d0._M_dataplus._M_p = (pointer)&local_19d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_19d0,"quantile_tau","");
  VW::config::typed_option<float>::typed_option(&local_ad0,&local_19d0,&local_1afc);
  ptVar12 = VW::config::typed_option<float>::default_value(&local_ad0,0.5);
  local_19f0[0] = local_19e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19f0,"Parameter \\tau associated with Quantile loss. Defaults to 0.5",
             "");
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_a30,ptVar12);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_a30);
  local_1a10._M_dataplus._M_p = (pointer)&local_1a10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a10,"l1","");
  local_1b08 = &all->l1_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1250,&local_1a10,local_1b08);
  local_1a30[0] = local_1a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a30,"l_1 lambda","");
  std::__cxx11::string::_M_assign((string *)(local_1250 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_b70,(typed_option<float> *)local_1250);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_b70);
  local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,"l2","");
  local_1af8 = &all->l2_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_12f0,&local_1598,local_1af8);
  local_1a50[0] = local_1a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a50,"l_2 lambda","");
  std::__cxx11::string::_M_assign((string *)(local_12f0 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_c10,(typed_option<float> *)local_12f0);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_c10);
  local_1a70._M_dataplus._M_p = (pointer)&local_1a70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a70,"no_bias_regularization","")
  ;
  local_1ad8 = &all->numpasses;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1390,&local_1a70,&all->no_bias);
  local_1a90[0] = local_1a80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a90,"no bias in regularization","");
  std::__cxx11::string::_M_assign((string *)(local_1390 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_cb0,(typed_option<bool> *)local_1390);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_cb0);
  local_15b8._M_dataplus._M_p = (pointer)&local_15b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_15b8,"named_labels","");
  local_1af0 = options;
  local_1ae0 = &all->holdout_set_off;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1430,&local_15b8,&local_1ab0);
  local_13c0 = true;
  local_15d8[0] = local_15c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15d8,
             "use names for labels (multiclass, etc.) rather than integers, argument specified all possible labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d50,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1430);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar8,&local_d50);
  local_d50.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce148;
  if (local_d50.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d50.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d50.super_base_option);
  if (local_15d8[0] != local_15c8) {
    operator_delete(local_15d8[0]);
  }
  local_1430._0_8_ = &PTR__typed_option_002ce148;
  if (local_1398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1398._M_pi);
  }
  if (local_13a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
    operator_delete(local_15b8._M_dataplus._M_p);
  }
  local_cb0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_cb0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_cb0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_cb0.super_base_option);
  if (local_1a90[0] != local_1a80) {
    operator_delete(local_1a90[0]);
  }
  local_1390._0_8_ = &PTR__typed_option_002ce110;
  if (local_12f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_12f8._M_pi);
  }
  if (local_1308._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1308._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != &local_1a70.field_2) {
    operator_delete(local_1a70._M_dataplus._M_p);
  }
  local_c10.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce0d8;
  if (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_c10.super_base_option);
  if (local_1a50[0] != local_1a40) {
    operator_delete(local_1a50[0]);
  }
  local_12f0._0_8_ = &PTR__typed_option_002ce0d8;
  if (local_1258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1258._M_pi);
  }
  if (local_1268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1268._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
    operator_delete(local_1598._M_dataplus._M_p);
  }
  local_b70.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce0d8;
  if (local_b70.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b70.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_b70.super_base_option);
  if (local_1a30[0] != local_1a20) {
    operator_delete(local_1a30[0]);
  }
  local_1250._0_8_ = &PTR__typed_option_002ce0d8;
  if (local_11b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11b8._M_pi);
  }
  if (local_11c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a10._M_dataplus._M_p != &local_1a10.field_2) {
    operator_delete(local_1a10._M_dataplus._M_p);
  }
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce0d8;
  if (local_a30.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a30.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if (local_19f0[0] != local_19e0) {
    operator_delete(local_19f0[0]);
  }
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce0d8;
  if (local_ad0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ad0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19d0._M_dataplus._M_p != &local_19d0.field_2) {
    operator_delete(local_19d0._M_dataplus._M_p);
  }
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce148;
  if (local_8f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if (local_19b0[0] != local_19a0) {
    operator_delete(local_19b0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1990._M_dataplus._M_p != &local_1990.field_2) {
    operator_delete(local_1990._M_dataplus._M_p);
  }
  local_990.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce148;
  if (local_990.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_990.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_990.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1970._M_dataplus._M_p != &local_1970.field_2) {
    operator_delete(local_1970._M_dataplus._M_p);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_850.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_1950[0] != local_1940) {
    operator_delete(local_1950[0]);
  }
  local_11b0._0_8_ = &PTR__typed_option_002ce110;
  if (local_1118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1118._M_pi);
  }
  if (local_1128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1128._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_11b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1930._M_dataplus._M_p != &local_1930.field_2) {
    operator_delete(local_1930._M_dataplus._M_p);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce0d8;
  if (local_7b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_1910[0] != local_1900) {
    operator_delete(local_1910[0]);
  }
  local_1110._0_8_ = &PTR__typed_option_002ce0d8;
  if (local_1078._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1078._M_pi);
  }
  if (local_1088._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1088._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f0._M_dataplus._M_p != &local_18f0.field_2) {
    operator_delete(local_18f0._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce0d8;
  if (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_18d0[0] != local_18c0) {
    operator_delete(local_18d0[0]);
  }
  local_1070._0_8_ = &PTR__typed_option_002ce0d8;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd8._M_pi);
  }
  poVar16 = local_1af0;
  if (local_fe8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fe8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1070);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18b0._M_dataplus._M_p != &local_18b0.field_2) {
    operator_delete(local_18b0._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_670.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_1890[0] != local_1880) {
    operator_delete(local_1890[0]);
  }
  local_fd0._0_8_ = &PTR__typed_option_002ce070;
  if (local_f38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f38._M_pi);
  }
  if (local_f48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1870._M_dataplus._M_p != &local_1870.field_2) {
    operator_delete(local_1870._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_5d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_1850[0] != local_1840) {
    operator_delete(local_1850[0]);
  }
  local_f30._0_8_ = &PTR__typed_option_002ce070;
  if (local_e98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e98._M_pi);
  }
  if (local_ea8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ea8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1830._M_dataplus._M_p != &local_1830.field_2) {
    operator_delete(local_1830._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_530.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_1810[0] != local_1800) {
    operator_delete(local_1810[0]);
  }
  local_e90._0_8_ = &PTR__typed_option_002ce070;
  if (local_df8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_df8._M_pi);
  }
  if (local_e08._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e08._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_e90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f0._M_dataplus._M_p != &local_17f0.field_2) {
    operator_delete(local_17f0._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_3f0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_17d0[0] != local_17c0) {
    operator_delete(local_17d0[0]);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_490.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17b0._M_dataplus._M_p != &local_17b0.field_2) {
    operator_delete(local_17b0._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_350.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_1790[0] != local_1780) {
    operator_delete(local_1790[0]);
  }
  local_df0._0_8_ = &PTR__typed_option_002ce180;
  if (local_d58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d58._M_pi);
  }
  if (local_d68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d68._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_df0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1770._M_dataplus._M_p != &local_1770.field_2) {
    operator_delete(local_1770._M_dataplus._M_p);
  }
  pbVar3 = local_1ae0;
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_210.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_1750[0] != local_1740) {
    operator_delete(local_1750[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  psVar4 = local_1ad8;
  if (local_2b0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1730._M_dataplus._M_p != &local_1730.field_2) {
    operator_delete(local_1730._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_1710[0] != local_1700) {
    operator_delete(local_1710[0]);
  }
  local_14d0._0_8_ = &PTR__typed_option_002ce110;
  if (local_1438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1438._M_pi);
  }
  if (local_1448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1448._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f0._M_dataplus._M_p != &local_16f0.field_2) {
    operator_delete(local_16f0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_16d0[0] != local_16c0) {
    operator_delete(local_16d0[0]);
  }
  if (local_16b0[0] != local_16a0) {
    operator_delete(local_16b0[0]);
  }
  local_1578._0_8_ = &PTR__typed_option_002ce110;
  if (local_14e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_14e0._M_pi);
  }
  if (local_14f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_14f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1690._M_dataplus._M_p != &local_1690.field_2) {
    operator_delete(local_1690._M_dataplus._M_p);
  }
  (**poVar16->_vptr_options_i)(poVar16,&local_1650);
  if ((local_1b09 == false) && ((all->eta != 0.0 || (NAN(all->eta))))) {
    all->training = true;
  }
  else {
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"only testing",0xc);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    all->training = false;
    if (all->lda != 0) {
      all->eta = 0.0;
    }
  }
  if (((*psVar4 < 2) && (*local_1ae8 == 0)) || (*pbVar3 == true)) {
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  *pbVar3 = bVar5;
  pp_Var2 = (_func_int **)(local_1578 + 0x10);
  local_1578._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1578,"min_prediction","");
  iVar6 = (*poVar16->_vptr_options_i[1])(poVar16,local_1578);
  bVar17 = 1;
  if ((char)iVar6 == '\0') {
    local_14d0._0_8_ = local_14d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14d0,"max_prediction","");
    iVar6 = (*poVar16->_vptr_options_i[1])(poVar16,local_14d0);
    bVar5 = local_1b09;
    if ((undefined1 *)local_14d0._0_8_ != local_14d0 + 0x10) {
      operator_delete((void *)local_14d0._0_8_);
    }
    bVar17 = (byte)iVar6 | bVar5;
    poVar16 = local_1af0;
  }
  if ((_func_int **)local_1578._0_8_ != pp_Var2) {
    operator_delete((void *)local_1578._0_8_);
  }
  if ((bVar17 & 1) != 0) {
    all->set_minmax = noop_mm;
  }
  local_1578._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1578,"named_labels","");
  iVar6 = (*poVar16->_vptr_options_i[1])(poVar16,local_1578);
  if ((_func_int **)local_1578._0_8_ != pp_Var2) {
    operator_delete((void *)local_1578._0_8_);
  }
  if ((char)iVar6 != '\0') {
    pnVar13 = calloc_or_throw<namedlabels>(1);
    all->sd->ldict = pnVar13;
    pnVar13 = all->sd->ldict;
    local_15f8._M_dataplus._M_p = (pointer)&local_15f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_15f8,local_1ab0._M_dataplus._M_p,
               local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
    namedlabels::namedlabels(pnVar13,&local_15f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15f8._M_dataplus._M_p != &local_15f8.field_2) {
      operator_delete(local_15f8._M_dataplus._M_p);
    }
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"parsed ",7);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," named labels",0xd);
      std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
  }
  local_1618._M_dataplus._M_p = (pointer)&local_1618.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1618,local_1ad0._M_dataplus._M_p,
             local_1ad0._M_dataplus._M_p + local_1ad0._M_string_length);
  plVar15 = getLossFunction(all,&local_1618,local_1afc);
  all->loss = plVar15;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1618._M_dataplus._M_p != &local_1618.field_2) {
    operator_delete(local_1618._M_dataplus._M_p);
  }
  fVar18 = *local_1b08;
  if (fVar18 < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "l1_lambda should be nonnegative: resetting from ",0x30);
    poVar14 = std::ostream::_M_insert<double>((double)*local_1b08);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," to 0",5);
    std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    *local_1b08 = 0.0;
    fVar18 = 0.0;
  }
  fVar19 = *local_1af8;
  if (fVar19 < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "l2_lambda should be nonnegative: resetting from ",0x30);
    poVar14 = std::ostream::_M_insert<double>((double)*local_1af8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," to 0",5);
    std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    *local_1af8 = 0.0;
    fVar18 = *local_1b08;
    fVar19 = 0.0;
  }
  uVar7 = (uint)(0.0 < fVar18) + all->reg_mode;
  all->reg_mode = uVar7 + (uint)(0.0 < fVar19) * 2;
  if (all->quiet == false) {
    if ((uVar7 & 1) != 0) {
      local_1578._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1578,"bfgs","");
      iVar6 = (*poVar16->_vptr_options_i[1])(poVar16,local_1578);
      if ((_func_int **)local_1578._0_8_ != pp_Var2) {
        operator_delete((void *)local_1578._0_8_);
      }
      if ((char)iVar6 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(all->trace_message).super_ostream,"using l1 regularization = ",0x1a);
        poVar14 = std::ostream::_M_insert<double>((double)*local_1b08);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
    }
    if (1 < all->reg_mode) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"using l2 regularization = ",0x1a);
      poVar14 = std::ostream::_M_insert<double>((double)*local_1af8);
      std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1650.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1650.m_name._M_dataplus._M_p != &local_1650.m_name.field_2) {
    operator_delete(local_1650.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != &local_1ad0.field_2) {
    operator_delete(local_1ad0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != &local_1ab0.field_2) {
    operator_delete(local_1ab0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_example_tweaks(options_i& options, vw& all)
{
  string named_labels;
  string loss_function;
  float loss_parameter = 0.0;
  size_t early_terminate_passes;
  bool test_only = false;

  option_group_definition example_options("Example options");
  example_options.add(make_option("testonly", test_only).short_name("t").help("Ignore label information and just test"))
      .add(make_option("holdout_off", all.holdout_set_off).help("no holdout data in multiple passes"))
      .add(make_option("holdout_period", all.holdout_period).default_value(10).help("holdout period for test only"))
      .add(make_option("holdout_after", all.holdout_after)
               .help("holdout after n training examples, default off (disables holdout_period)"))
      .add(
          make_option("early_terminate", early_terminate_passes)
              .default_value(3)
              .help(
                  "Specify the number of passes tolerated when holdout loss doesn't decrease before early termination"))
      .add(make_option("passes", all.numpasses).help("Number of Training Passes"))
      .add(make_option("initial_pass_length", all.pass_length).help("initial number of examples per pass"))
      .add(make_option("examples", all.max_examples).help("number of examples to parse"))
      .add(make_option("min_prediction", all.sd->min_label).help("Smallest prediction to output"))
      .add(make_option("max_prediction", all.sd->max_label).help("Largest prediction to output"))
      .add(make_option("sort_features", all.p->sort_features)
               .help("turn this on to disregard order in which features have been defined. This will lead to smaller "
                     "cache sizes"))
      .add(make_option("loss_function", loss_function)
               .default_value("squared")
               .help("Specify the loss function to be used, uses squared by default. Currently available ones are "
                     "squared, classic, hinge, logistic, quantile and poisson."))
      .add(make_option("quantile_tau", loss_parameter)
               .default_value(0.5f)
               .help("Parameter \\tau associated with Quantile loss. Defaults to 0.5"))
      .add(make_option("l1", all.l1_lambda).help("l_1 lambda"))
      .add(make_option("l2", all.l2_lambda).help("l_2 lambda"))
      .add(make_option("no_bias_regularization", all.no_bias).help("no bias in regularization"))
      .add(make_option("named_labels", named_labels)
               .keep()
               .help("use names for labels (multiclass, etc.) rather than integers, argument specified all possible "
                     "labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""));
  options.add_and_parse(example_options);

  if (test_only || all.eta == 0.)
  {
    if (!all.quiet)
      all.trace_message << "only testing" << endl;
    all.training = false;
    if (all.lda > 0)
      all.eta = 0;
  }
  else
    all.training = true;

  if ((all.numpasses > 1 || all.holdout_after > 0) && !all.holdout_set_off)
    all.holdout_set_off = false;  // holdout is on unless explicitly off
  else
    all.holdout_set_off = true;

  if (options.was_supplied("min_prediction") || options.was_supplied("max_prediction") || test_only)
    all.set_minmax = noop_mm;

  if (options.was_supplied("named_labels"))
  {
    all.sd->ldict = &calloc_or_throw<namedlabels>();
    new (all.sd->ldict) namedlabels(named_labels);
    if (!all.quiet)
      all.trace_message << "parsed " << all.sd->ldict->getK() << " named labels" << endl;
  }

  all.loss = getLossFunction(all, loss_function, loss_parameter);

  if (all.l1_lambda < 0.)
  {
    all.trace_message << "l1_lambda should be nonnegative: resetting from " << all.l1_lambda << " to 0" << endl;
    all.l1_lambda = 0.;
  }
  if (all.l2_lambda < 0.)
  {
    all.trace_message << "l2_lambda should be nonnegative: resetting from " << all.l2_lambda << " to 0" << endl;
    all.l2_lambda = 0.;
  }
  all.reg_mode += (all.l1_lambda > 0.) ? 1 : 0;
  all.reg_mode += (all.l2_lambda > 0.) ? 2 : 0;
  if (!all.quiet)
  {
    if (all.reg_mode % 2 && !options.was_supplied("bfgs"))
      all.trace_message << "using l1 regularization = " << all.l1_lambda << endl;
    if (all.reg_mode > 1)
      all.trace_message << "using l2 regularization = " << all.l2_lambda << endl;
  }
}